

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O0

Value * __thiscall Kgc::allocSpecial(Kgc *this,ValueType type)

{
  bool bVar1;
  vector<Value_*,_std::allocator<Value_*>_> *this_00;
  reference ppVVar2;
  Value *last;
  vector<Value_*,_std::allocator<Value_*>_> *v;
  ValueType type_local;
  Kgc *this_local;
  
  this_00 = this->reserved + (int)type;
  bVar1 = std::vector<Value_*,_std::allocator<Value_*>_>::empty(this_00);
  if (bVar1) {
    this_local = (Kgc *)allocNew(this,type);
  }
  else {
    ppVVar2 = std::vector<Value_*,_std::allocator<Value_*>_>::back(this_00);
    this_local = (Kgc *)*ppVVar2;
    std::vector<Value_*,_std::allocator<Value_*>_>::pop_back(this_00);
  }
  return (Value *)this_local;
}

Assistant:

Value* Kgc::allocSpecial(ValueType type)
{
    std::vector<Value *> &v = reserved[(int)type];
    
    if (!v.empty())
    {
        Value *last = v.back();
        v.pop_back();
        return last;
    }
    return allocNew(type);
}